

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::base_internal::StrError_abi_cxx11_
          (string *__return_storage_ptr__,base_internal *this,int errnum)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  string *this_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar4;
  int extraout_EDX_02;
  int extraout_EDX_03;
  string *this_01;
  size_t i;
  _anonymous_namespace_ *local_60;
  string local_50;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  iVar4 = extraout_EDX;
  if (StrError[abi:cxx11](int)::table_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&StrError[abi:cxx11](int)::table_abi_cxx11_);
    iVar4 = extraout_EDX_00;
    if (iVar2 != 0) {
      this_00 = (string *)operator_new(0x10e0);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_135UL>
      ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_135UL>
               *)this_00);
      iVar4 = extraout_EDX_01;
      this_01 = this_00;
      for (local_60 = (_anonymous_namespace_ *)0x0; local_60 != (_anonymous_namespace_ *)0x87;
          local_60 = local_60 + 1) {
        (anonymous_namespace)::StrErrorInternal_abi_cxx11_(&local_50,local_60,iVar4);
        std::__cxx11::string::operator=(this_01,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        this_01 = this_01 + 0x20;
        iVar4 = extraout_EDX_02;
      }
      StrError[abi:cxx11](int)::table_abi_cxx11_ =
           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_135UL>
            *)this_00;
      __cxa_guard_release(&StrError[abi:cxx11](int)::table_abi_cxx11_);
      iVar4 = extraout_EDX_03;
    }
  }
  if ((uint)this < 0x87) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               (StrError[abi:cxx11](int)::table_abi_cxx11_->_M_elems + ((ulong)this & 0xffffffff)));
  }
  else {
    (anonymous_namespace)::StrErrorInternal_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)((ulong)this & 0xffffffff),iVar4);
  }
  *piVar3 = iVar1;
  return __return_storage_ptr__;
}

Assistant:

std::string StrError(int errnum) {
  absl::base_internal::ErrnoSaver errno_saver;
  static const auto* table = NewStrErrorTable();
  if (errnum >= 0 && static_cast<size_t>(errnum) < table->size()) {
    return (*table)[static_cast<size_t>(errnum)];
  }
  return StrErrorInternal(errnum);
}